

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tutorial.cpp
# Opt level: O3

void __thiscall
LibraryBook::LibraryBook
          (LibraryBook *this,string *title_,string *author_,int available_copies_,string *language_,
          int pages_,string *isbn_)

{
  pointer pcVar1;
  
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  pcVar1 = (title_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + title_->_M_string_length)
  ;
  (this->author)._M_dataplus._M_p = (pointer)&(this->author).field_2;
  pcVar1 = (author_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->author,pcVar1,pcVar1 + author_->_M_string_length);
  this->available_copies = available_copies_;
  (this->language)._M_dataplus._M_p = (pointer)&(this->language).field_2;
  pcVar1 = (language_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->language,pcVar1,pcVar1 + language_->_M_string_length);
  this->pages = pages_;
  (this->isbn)._M_dataplus._M_p = (pointer)&(this->isbn).field_2;
  pcVar1 = (isbn_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->isbn,pcVar1,pcVar1 + isbn_->_M_string_length);
  return;
}

Assistant:

LibraryBook(std::string title_,
                std::string author_,
                int available_copies_,
                std::string language_,
                int pages_,
                std::string isbn_)
        : title(title_)
        , author(author_)
        , available_copies(available_copies_)
        , language(language_)
        , pages(pages_)
        , isbn(isbn_)
    {
    }